

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encodings.hpp
# Opt level: O2

string * __thiscall
webfront::base64::detail::encode_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,uint8_t *input,size_t size)

{
  char cVar1;
  __const_iterator __position;
  uint8_t *puVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
  _M_construct(__return_storage_ptr__,((long)input * 4 + 8U) / 3,'\0');
  __position._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  for (puVar2 = (uint8_t *)0x0; puVar2 < input + -2; puVar2 = puVar2 + 3) {
    *__position._M_current = encode::code._M_elems[(byte)this[(long)puVar2] >> 2];
    __position._M_current[1] =
         encode::code._M_elems
         [(uint)((byte)(this + 1)[(long)puVar2] >> 4) | ((byte)this[(long)puVar2] & 3) << 4];
    __position._M_current[2] =
         encode::code._M_elems
         [(uint)((byte)(this + 2)[(long)puVar2] >> 6) + ((byte)(this + 1)[(long)puVar2] & 0xf) * 4];
    __position._M_current[3] = encode::code._M_elems[(byte)(this + 2)[(long)puVar2] & 0x3f];
    __position._M_current = __position._M_current + 4;
  }
  if (puVar2 < input) {
    *__position._M_current = encode::code._M_elems[(byte)this[(long)puVar2] >> 2];
    if (input + -1 == puVar2) {
      __position._M_current[1] = encode::code._M_elems[((byte)this[(long)puVar2] & 3) << 4];
      cVar1 = '=';
    }
    else {
      __position._M_current[1] =
           encode::code._M_elems
           [(byte)((char)this[(long)puVar2] << 4 | (byte)(this + 1)[(long)puVar2] >> 4) & 0x3f];
      cVar1 = encode::code._M_elems[(ulong)((byte)(this + 1)[(long)puVar2] & 0xf) * 4];
    }
    __position._M_current[2] = cVar1;
    __position._M_current[3] = '=';
    __position._M_current = __position._M_current + 4;
  }
  if (__position._M_current !=
      (__return_storage_ptr__->_M_dataplus)._M_p + __return_storage_ptr__->_M_string_length) {
    http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (__return_storage_ptr__,__position);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]]inline std::string encode(const uint8_t* input, size_t size) {
    static constexpr std::array code = {'A', 'B', 'C', 'D', 'E', 'F', 'G', 'H', 'I', 'J', 'K', 'L', 'M', 'N', 'O', 'P', 'Q', 'R', 'S', 'T', 'U', 'V',
                                    'W', 'X', 'Y', 'Z', 'a', 'b', 'c', 'd', 'e', 'f', 'g', 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p', 'q', 'r',
                                    's', 't', 'u', 'v', 'w', 'x', 'y', 'z', '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', '+', '/'};

    std::string output((4 * (size + 2) / 3), '\0');
    auto coded = output.begin();
    size_t i = 0;
    for (; i < size - 2; i += 3) {
        *coded++ = code[(input[i] >> 2) & 0x3Fu];
        *coded++ = code[((input[i] & 0x3u) << 4) | ((input[i + 1] & 0xF0u) >> 4)];
        *coded++ = code[((input[i + 1] & 0xFu) << 2) | ((input[i + 2] & 0xC0u) >> 6)];
        *coded++ = code[input[i + 2] & 0x3Fu];
    }
    if (i < size) {
        *coded++ = code[static_cast<size_t>(input[i] >> 2) & 0x3Fu];
        if (i == (size - 1)) {
            *coded++ = code[static_cast<size_t>(input[i] & 0x3u) << 4];
            *coded++ = '=';
        }
        else {
            *coded++ = code[static_cast<size_t>((input[i] & 0x3u) << 4 | ((input[i + 1] & 0xF0u) >> 4)) & 0x3Fu];
            *coded++ = code[static_cast<size_t>((input[i + 1] & 0xFu) << 2) & 0x3Fu];
        }
        *coded++ = '=';
    }
    if (coded != output.end()) output.erase(coded);

    return output;
}